

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArealObjectStatePdu.cpp
# Opt level: O3

void __thiscall DIS::ArealObjectStatePdu::ArealObjectStatePdu(ArealObjectStatePdu *this)

{
  SyntheticEnvironmentFamilyPdu::SyntheticEnvironmentFamilyPdu
            (&this->super_SyntheticEnvironmentFamilyPdu);
  (this->super_SyntheticEnvironmentFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__ArealObjectStatePdu_0019f538;
  EntityID::EntityID(&this->_objectID);
  EntityID::EntityID(&this->_referencedObjectID);
  this->_updateNumber = 0;
  this->_forceID = '\0';
  this->_modifications = '\0';
  EntityType::EntityType(&this->_objectType);
  SixByteChunk::SixByteChunk(&this->_objectAppearance);
  this->_numberOfPoints = 0;
  SimulationAddress::SimulationAddress(&this->_requesterID);
  SimulationAddress::SimulationAddress(&this->_receivingID);
  (this->_objectLocation).
  super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_objectLocation).
  super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_objectLocation).
  super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Pdu::setPduType((Pdu *)this,'-');
  return;
}

Assistant:

ArealObjectStatePdu::ArealObjectStatePdu() : SyntheticEnvironmentFamilyPdu(),
   _objectID(), 
   _referencedObjectID(), 
   _updateNumber(0), 
   _forceID(0), 
   _modifications(0), 
   _objectType(), 
   _objectAppearance(), 
   _numberOfPoints(0), 
   _requesterID(), 
   _receivingID()
{
    setPduType( 45 );
}